

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

void cuddRehash(DdManager *unique,int i)

{
  uint *puVar1;
  int *piVar2;
  double dVar3;
  DdSubtable *pDVar4;
  DdManager *pDVar5;
  ulong uVar6;
  ulong uVar7;
  DdNode *pDVar8;
  DdNode **ppDVar9;
  _func_void_long *p_Var10;
  DdNode **ppDVar11;
  int iVar12;
  DdNode **ppDVar13;
  long lVar14;
  ulong uVar15;
  DdNode **ppDVar16;
  DdNode *pDVar17;
  DdManager *pDVar18;
  uint uVar19;
  DdNode **ppDVar20;
  DdNode **ppDVar21;
  uint uVar22;
  uint uVar23;
  DdNode **__ptr;
  
  dVar3 = unique->gcFrac;
  if (((dVar3 != 4.0) || (NAN(dVar3))) || (unique->slots <= unique->looseUpTo)) {
    if ((dVar3 == 0.2) && (!NAN(dVar3))) goto LAB_0066cbf8;
  }
  else {
    unique->gcFrac = 1.0;
    unique->minDead = unique->slots;
  }
  if (unique->maxmem < unique->memused) {
    unique->gcFrac = 0.2;
    unique->minDead = (uint)(long)((double)unique->slots * 0.2);
    cuddShrinkDeathRow(unique);
    iVar12 = cuddGarbageCollect(unique,1);
    if (0 < iVar12) {
      return;
    }
  }
LAB_0066cbf8:
  p_Var10 = Extra_UtilMMoutOfMemory;
  if (i == 0x7fffffff) {
    uVar23 = (unique->constants).slots;
    iVar12 = (unique->constants).shift;
    __ptr = (unique->constants).nodelist;
    uVar22 = uVar23 * 2;
    ppDVar13 = (DdNode **)malloc((ulong)uVar22 * 8);
    if (ppDVar13 == (DdNode **)0x0) {
      Extra_UtilMMoutOfMemory = p_Var10;
      fwrite("Unable to resize constant subtable for lack of memory\n",0x36,1,(FILE *)unique->err);
      cuddGarbageCollect(unique,1);
      lVar14 = 0;
      uVar23 = unique->size;
      if (unique->size < 1) {
        uVar23 = 0;
      }
      for (; (ulong)uVar23 * 0x38 - lVar14 != 0; lVar14 = lVar14 + 0x38) {
        piVar2 = (int *)((long)&unique->subtables->maxKeys + lVar14);
        *piVar2 = *piVar2 << 1;
      }
      puVar1 = &(unique->constants).maxKeys;
      *puVar1 = *puVar1 << 1;
      return;
    }
    iVar12 = iVar12 + -1;
    Extra_UtilMMoutOfMemory = p_Var10;
    (unique->constants).slots = uVar22;
    (unique->constants).shift = iVar12;
    (unique->constants).maxKeys = uVar23 * 8;
    (unique->constants).nodelist = ppDVar13;
    for (uVar15 = 0; uVar22 != uVar15; uVar15 = uVar15 + 1) {
      ppDVar13[uVar15] = (DdNode *)0x0;
    }
    for (uVar15 = 0; uVar15 != uVar23; uVar15 = uVar15 + 1) {
      pDVar17 = __ptr[uVar15];
      while (pDVar17 != (DdNode *)0x0) {
        pDVar8 = pDVar17->next;
        uVar19 = (uint)(((int)((ulong)*(undefined8 *)&pDVar17->type >> 0x20) +
                        (int)*(undefined8 *)&pDVar17->type * 0xc00005) * 0x40f1f9) >>
                 ((byte)iVar12 & 0x1f);
        pDVar17->next = ppDVar13[(int)uVar19];
        ppDVar13[(int)uVar19] = pDVar17;
        pDVar17 = pDVar8;
      }
    }
  }
  else {
    pDVar4 = unique->subtables;
    uVar23 = pDVar4[i].slots;
    iVar12 = pDVar4[i].shift;
    __ptr = pDVar4[i].nodelist;
    uVar22 = uVar23 * 2;
    ppDVar13 = (DdNode **)malloc((ulong)uVar22 * 8);
    if (ppDVar13 == (DdNode **)0x0) {
      Extra_UtilMMoutOfMemory = p_Var10;
      fprintf((FILE *)unique->err,"Unable to resize subtable %d for lack of memory\n",(ulong)(uint)i
             );
      cuddGarbageCollect(unique,1);
      if (unique->stash == (char *)0x0) {
        return;
      }
      free(unique->stash);
      unique->stash = (char *)0x0;
      cuddSlowTableGrowth(unique);
      return;
    }
    iVar12 = iVar12 + -1;
    Extra_UtilMMoutOfMemory = p_Var10;
    pDVar4[i].nodelist = ppDVar13;
    pDVar4[i].slots = uVar22;
    pDVar4[i].shift = iVar12;
    pDVar4[i].maxKeys = uVar23 * 8;
    for (uVar15 = 0; uVar15 != uVar23; uVar15 = uVar15 + 1) {
      ppDVar16 = (DdNode **)(((long)(uVar15 << 0x21) >> 0x1d) + (long)ppDVar13);
      pDVar18 = (DdManager *)__ptr[uVar15];
      ppDVar20 = ppDVar13 + ((int)uVar15 * 2 + 1);
      while (pDVar18 != unique) {
        ppDVar11 = &(pDVar18->sentinel).next;
        pDVar5 = (DdManager *)(pDVar18->sentinel).next;
        uVar6 = *(ulong *)&(pDVar18->sentinel).type;
        uVar7 = *(ulong *)((long)&(pDVar18->sentinel).type + 8);
        ppDVar21 = ppDVar20;
        ppDVar9 = ppDVar16;
        if (((((uint)uVar7 & 1) + *(int *)((uVar7 & 0xfffffffffffffffe) + 0x20) * 2 +
             (((uint)uVar6 & 1) + *(int *)((uVar6 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
             0x40f1f9 & 1 << ((byte)iVar12 & 0x1f)) != 0) {
          ppDVar21 = ppDVar11;
          ppDVar9 = ppDVar20;
          ppDVar11 = ppDVar16;
        }
        ppDVar16 = ppDVar11;
        *ppDVar9 = &pDVar18->sentinel;
        pDVar18 = pDVar5;
        ppDVar20 = ppDVar21;
      }
      *ppDVar20 = &unique->sentinel;
      *ppDVar16 = &unique->sentinel;
    }
  }
  free(__ptr);
  unique->memused = unique->memused + (ulong)(uVar22 - uVar23) * 8;
  unique->slots = unique->slots + (uVar22 - uVar23);
  ddFixLimits(unique);
  return;
}

Assistant:

void
cuddRehash(
  DdManager * unique,
  int i)
{
    unsigned int slots, oldslots;
    int shift, oldshift;
    int j, pos;
    DdNodePtr *nodelist, *oldnodelist;
    DdNode *node, *next;
    DdNode *sentinel = &(unique->sentinel);
    hack split;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (unique->gcFrac == DD_GC_FRAC_HI && unique->slots > unique->looseUpTo) {
        unique->gcFrac = DD_GC_FRAC_LO;
        unique->minDead = (unsigned) (DD_GC_FRAC_LO * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_LO);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
    }

    if (unique->gcFrac != DD_GC_FRAC_MIN && unique->memused > unique->maxmem) {
        unique->gcFrac = DD_GC_FRAC_MIN;
        unique->minDead = (unsigned) (DD_GC_FRAC_MIN * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_MIN);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
        cuddShrinkDeathRow(unique);
        if (cuddGarbageCollect(unique,1) > 0) return;
    }

    if (i != CUDD_CONST_INDEX) {
        oldslots = unique->subtables[i].slots;
        oldshift = unique->subtables[i].shift;
        oldnodelist = unique->subtables[i].nodelist;

        /* Compute the new size of the subtable. */
        slots = oldslots << 1;
        shift = oldshift - 1;

        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            (void) fprintf(unique->err,
                           "Unable to resize subtable %d for lack of memory\n",
                           i);
            /* Prevent frequent resizing attempts. */
            (void) cuddGarbageCollect(unique,1);
            if (unique->stash != NULL) {
                ABC_FREE(unique->stash);
                unique->stash = NULL;
                /* Inhibit resizing of tables. */
                cuddSlowTableGrowth(unique);
            }
            return;
        }
        unique->subtables[i].nodelist = nodelist;
        unique->subtables[i].slots = slots;
        unique->subtables[i].shift = shift;
        unique->subtables[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;

        /* Move the nodes from the old table to the new table.
        ** This code depends on the type of hash function.
        ** It assumes that the effect of doubling the size of the table
        ** is to retain one more bit of the 32-bit hash value.
        ** The additional bit is the LSB. */
        for (j = 0; (unsigned) j < oldslots; j++) {
            DdNodePtr *evenP, *oddP;
            node = oldnodelist[j];
            evenP = &(nodelist[j<<1]);
            oddP = &(nodelist[(j<<1)+1]);
            while (node != sentinel) {
                next = node->next;
                pos = ddHash(cuddF2L(cuddT(node)), cuddF2L(cuddE(node)), shift);
                if (pos & 1) {
                    *oddP = node;
                    oddP = &(node->next);
                } else {
                    *evenP = node;
                    evenP = &(node->next);
                }
                node = next;
            }
            *evenP = *oddP = sentinel;
        }
        ABC_FREE(oldnodelist);

#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "rehashing layer %d: keys %d dead %d new size %d\n",
                       i, unique->subtables[i].keys,
                       unique->subtables[i].dead, slots);
#endif
    } else {
        oldslots = unique->constants.slots;
        oldshift = unique->constants.shift;
        oldnodelist = unique->constants.nodelist;

        /* The constant subtable is never subjected to reordering.
        ** Therefore, when it is resized, it is because it has just
        ** reached the maximum load. We can safely just double the size,
        ** with no need for the loop we use for the other tables.
        */
        slots = oldslots << 1;
        shift = oldshift - 1;
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            (void) fprintf(unique->err,
                           "Unable to resize constant subtable for lack of memory\n");
            (void) cuddGarbageCollect(unique,1);
            for (j = 0; j < unique->size; j++) {
                unique->subtables[j].maxKeys <<= 1;
            }
            unique->constants.maxKeys <<= 1;
            return;
        }
        unique->constants.slots = slots;
        unique->constants.shift = shift;
        unique->constants.maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        unique->constants.nodelist = nodelist;
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        for (j = 0; (unsigned) j < oldslots; j++) {
            node = oldnodelist[j];
            while (node != NULL) {
                next = node->next;
                split.value = cuddV(node);
                pos = ddHash(split.bits[0], split.bits[1], shift);
                node->next = nodelist[pos];
                nodelist[pos] = node;
                node = next;
            }
        }
        ABC_FREE(oldnodelist);

#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "rehashing constants: keys %d dead %d new size %d\n",
                       unique->constants.keys,unique->constants.dead,slots);
#endif
    }

    /* Update global data */

    unique->memused += (slots - oldslots) * sizeof(DdNodePtr);
    unique->slots += (slots - oldslots);
    ddFixLimits(unique);

}